

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

Gia_Man_t * Shr_ManFree(Shr_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pTemp;
  Shr_Man_t *p_local;
  
  Gia_ManHashStop(p->pNew);
  Vec_IntFreeP(&p->pNew->vLevels);
  iVar2 = Gia_ManHasDangling(p->pNew);
  if (iVar2 != 0) {
    pGVar1 = p->pNew;
    pGVar6 = Gia_ManCleanup(pGVar1);
    p->pNew = pGVar6;
    iVar2 = Gia_ManAndNum(p->pNew);
    iVar3 = Gia_ManAndNum(pGVar1);
    if (iVar2 != iVar3) {
      uVar4 = Gia_ManAndNum(pGVar1);
      uVar5 = Gia_ManAndNum(p->pNew);
      printf("Node reduction after sweep %6d -> %6d.\n",(ulong)uVar4,(ulong)uVar5);
    }
    Gia_ManStop(pGVar1);
  }
  pGVar1 = p->pNew;
  iVar2 = Gia_ManRegNum(p->pGia);
  Gia_ManSetRegNum(pGVar1,iVar2);
  pGVar1 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Rsb_ManFree(p->pManRsb);
  Bdc_ManFree(p->pManDec);
  Gia_ManStopP(&p->pNew);
  Vec_WrdFree(p->vFanMem);
  Vec_IntFree(p->vObj2Fan);
  Vec_IntFree(p->vDivs);
  Vec_IntFree(p->vPrio);
  Vec_WrdFree(p->vTruths);
  Vec_WrdFree(p->vDivTruths);
  Vec_IntFree(p->vDivResub);
  Vec_IntFree(p->vLeaves);
  if (p != (Shr_Man_t *)0x0) {
    free(p);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Shr_ManFree( Shr_Man_t * p )
{
    // prepare the manager
    Gia_Man_t * pTemp;
    Gia_ManHashStop( p->pNew );
    Vec_IntFreeP( &p->pNew->vLevels );
    if ( Gia_ManHasDangling(p->pNew) )
    {
        p->pNew = Gia_ManCleanup( pTemp = p->pNew );
        if ( Gia_ManAndNum(p->pNew) != Gia_ManAndNum(pTemp) )
            printf( "Node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(p->pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( p->pNew, Gia_ManRegNum(p->pGia) );
    pTemp = p->pNew; p->pNew = NULL;
    // free data structures
    Rsb_ManFree( p->pManRsb );
    Bdc_ManFree( p->pManDec );
    Gia_ManStopP( &p->pNew );
    Vec_WrdFree( p->vFanMem );
    Vec_IntFree( p->vObj2Fan );
    Vec_IntFree( p->vDivs );
    Vec_IntFree( p->vPrio );
    Vec_WrdFree( p->vTruths );
    Vec_WrdFree( p->vDivTruths );
    Vec_IntFree( p->vDivResub );
    Vec_IntFree( p->vLeaves );
    ABC_FREE( p );
    return pTemp;
}